

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O0

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::string_t,duckdb::string_t,bool,duckdb::BinaryStandardOperatorWrapper,duckdb::PrefixOperator,bool,false,true>
               (string_t *ldata,string_t *rdata,bool *result_data,idx_t count,ValidityMask *mask,
               bool fun)

{
  ValidityMask *mask_00;
  string_t right;
  string_t right_00;
  string_t right_01;
  string_t left;
  string_t left_00;
  string_t left_01;
  bool bVar1;
  undefined8 *puVar2;
  unsigned_long in_RCX;
  void *in_RDX;
  undefined8 *in_RSI;
  void *in_RDI;
  TemplatedValidityMask<unsigned_long> *in_R8;
  byte in_R9B;
  string_t rentry_2;
  string_t lentry_2;
  idx_t i;
  string_t rentry_1;
  string_t lentry_1;
  idx_t start;
  string_t rentry;
  string_t lentry;
  idx_t next;
  unsigned_long validity_entry;
  idx_t entry_idx;
  idx_t entry_count;
  idx_t base_idx;
  idx_t in_stack_fffffffffffffed0;
  TemplatedValidityMask<unsigned_long> *in_stack_fffffffffffffed8;
  ValidityMask *in_stack_fffffffffffffee8;
  undefined8 in_stack_fffffffffffffef0;
  undefined8 in_stack_fffffffffffffef8;
  undefined8 in_stack_ffffffffffffff00;
  undefined8 in_stack_ffffffffffffff08;
  undefined8 in_stack_ffffffffffffff10;
  ulong uVar3;
  idx_t in_stack_ffffffffffffff20;
  idx_t local_a8;
  unsigned_long local_a0;
  undefined8 local_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 local_60;
  unsigned_long local_58;
  unsigned_long local_50;
  ulong local_48;
  ulong local_40;
  unsigned_long local_38;
  byte local_29;
  TemplatedValidityMask<unsigned_long> *local_28;
  unsigned_long local_20;
  void *local_18;
  undefined8 *local_10;
  void *local_8;
  
  local_29 = in_R9B & 1;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  AssertRestrictFunction
            (in_RDI,(void *)((long)in_RDI + in_RCX * 0x10),in_RDX,(void *)((long)in_RDX + in_RCX),
             "/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/include/duckdb/common/vector_operations/binary_executor.hpp"
             ,0x4d);
  bVar1 = TemplatedValidityMask<unsigned_long>::AllValid(local_28);
  if (bVar1) {
    for (uVar3 = 0; uVar3 < local_20; uVar3 = uVar3 + 1) {
      puVar2 = (undefined8 *)((long)local_8 + uVar3 * 0x10);
      mask_00 = (ValidityMask *)puVar2[1];
      left_01.value.pointer.ptr = (char *)uVar3;
      left_01.value._0_8_ = mask_00;
      right_01.value.pointer.ptr = (char *)*puVar2;
      right_01.value._0_8_ = local_10[1];
      bVar1 = BinaryStandardOperatorWrapper::
              Operation<bool,duckdb::PrefixOperator,duckdb::string_t,duckdb::string_t,bool>
                        (SUB81((ulong)*local_10 >> 0x38,0),left_01,right_01,mask_00,
                         in_stack_ffffffffffffff20);
      *(bool *)((long)local_18 + uVar3) = bVar1;
    }
  }
  else {
    local_38 = 0;
    local_40 = TemplatedValidityMask<unsigned_long>::EntryCount(0x13c6692);
    for (local_48 = 0; local_48 < local_40; local_48 = local_48 + 1) {
      local_50 = TemplatedValidityMask<unsigned_long>::GetValidityEntry
                           (in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
      local_58 = MinValue<unsigned_long>(local_38 + 0x40,local_20);
      bVar1 = TemplatedValidityMask<unsigned_long>::AllValid(local_50);
      if (bVar1) {
        for (; local_38 < local_58; local_38 = local_38 + 1) {
          puVar2 = (undefined8 *)((long)local_8 + local_38 * 0x10);
          local_88 = *puVar2;
          local_80 = puVar2[1];
          local_98 = *local_10;
          local_90 = local_10[1];
          left.value.pointer.ptr = (char *)in_stack_ffffffffffffff10;
          left.value._0_8_ = in_stack_ffffffffffffff08;
          right.value.pointer.ptr = (char *)in_stack_ffffffffffffff00;
          right.value._0_8_ = in_stack_fffffffffffffef8;
          local_78 = local_98;
          local_70 = local_90;
          local_68 = local_88;
          local_60 = local_80;
          bVar1 = BinaryStandardOperatorWrapper::
                  Operation<bool,duckdb::PrefixOperator,duckdb::string_t,duckdb::string_t,bool>
                            (SUB81((ulong)in_stack_fffffffffffffef0 >> 0x38,0),left,right,
                             in_stack_fffffffffffffee8,in_stack_ffffffffffffff20);
          *(bool *)((long)local_18 + local_38) = bVar1;
        }
      }
      else {
        bVar1 = TemplatedValidityMask<unsigned_long>::NoneValid(local_50);
        if (bVar1) {
          local_38 = local_58;
        }
        else {
          local_a0 = local_38;
          for (; local_38 < local_58; local_38 = local_38 + 1) {
            local_a8 = local_38 - local_a0;
            bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid(&local_50,&local_a8);
            if (bVar1) {
              in_stack_ffffffffffffff20 = local_10[1];
              left_00.value.pointer.ptr = (char *)in_stack_ffffffffffffff10;
              left_00.value._0_8_ = in_stack_ffffffffffffff08;
              right_00.value.pointer.ptr = (char *)in_stack_ffffffffffffff00;
              right_00.value._0_8_ = in_stack_fffffffffffffef8;
              bVar1 = BinaryStandardOperatorWrapper::
                      Operation<bool,duckdb::PrefixOperator,duckdb::string_t,duckdb::string_t,bool>
                                (SUB81((ulong)in_stack_fffffffffffffef0 >> 0x38,0),left_00,right_00,
                                 in_stack_fffffffffffffee8,in_stack_ffffffffffffff20);
              *(bool *)((long)local_18 + local_38) = bVar1;
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}